

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassExtensionFieldInfo
          (Generator *this,GeneratorOptions *options,Printer *printer,Descriptor *desc)

{
  string local_40;
  
  if (0 < *(int *)(desc + 0x78)) {
    (anonymous_namespace)::GetMessagePath_abi_cxx11_
              (&local_40,(_anonymous_namespace_ *)(options->namespace_prefix)._M_dataplus._M_p,
               (GeneratorOptions *)(options->namespace_prefix)._M_string_length,desc);
    io::Printer::Print<char[6],std::__cxx11::string>
              (printer,
               "\n/**\n * The extensions registered with this message class. This is a map of\n * extension field number to fieldInfo object.\n *\n * For example:\n *     { 123: {fieldIndex: 123, fieldName: {my_field_name: 0}, ctor: proto.example.MyMessage} }\n *\n * fieldName contains the JsCompiler renamed field name property so that it\n * works in OPTIMIZED mode.\n *\n * @type {!Object<number, jspb.ExtensionFieldInfo>}\n */\n$class$.extensions = {};\n\n"
               ,(char (*) [6])0x39ef2d,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    (anonymous_namespace)::GetMessagePath_abi_cxx11_
              (&local_40,(_anonymous_namespace_ *)(options->namespace_prefix)._M_dataplus._M_p,
               (GeneratorOptions *)(options->namespace_prefix)._M_string_length,desc);
    io::Printer::Print<char[6],std::__cxx11::string>
              (printer,
               "\n/**\n * The extensions registered with this message class. This is a map of\n * extension field number to fieldInfo object.\n *\n * For example:\n *     { 123: {fieldIndex: 123, fieldName: {my_field_name: 0}, ctor: proto.example.MyMessage} }\n *\n * fieldName contains the JsCompiler renamed field name property so that it\n * works in OPTIMIZED mode.\n *\n * @type {!Object<number, jspb.ExtensionFieldBinaryInfo>}\n */\n$class$.extensionsBinary = {};\n\n"
               ,(char (*) [6])0x39ef2d,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

bool IsExtendable(const Descriptor* desc) {
  return desc->extension_range_count() > 0;
}